

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp
# Opt level: O3

IterateResult __thiscall
glcts::RequestsToSetUpMultisampleStencilTexturesWithUnsupportedNumberOfSamplesAreRejectedTest::
iterate(RequestsToSetUpMultisampleStencilTexturesWithUnsupportedNumberOfSamplesAreRejectedTest *this
       )

{
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  long lVar6;
  TestError *this_00;
  char *description;
  bool bVar7;
  qpTestResult testResult;
  TestContext *this_01;
  bool bVar8;
  GLint internalformat_specific_max_samples;
  GLint max_depth_texture_samples;
  int local_40;
  int local_3c;
  RequestsToSetUpMultisampleStencilTexturesWithUnsupportedNumberOfSamplesAreRejectedTest *local_38;
  long lVar5;
  
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,
                     "GL_OES_texture_storage_multisample_2d_array");
  this->gl_oes_texture_multisample_2d_array_supported = bVar2;
  if (bVar2) {
    iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar5 = CONCAT44(extraout_var,iVar3);
    initInternals(this);
    local_38 = this;
    if (this->to_id == 0) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Texture object has not been generated.","to_id != 0",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
                 ,0x340);
LAB_00c072e6:
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    lVar6 = 0;
    local_40 = 0;
    local_3c = 0;
    (**(code **)(lVar5 + 0x868))(0x910f);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"Querying maximum sample value failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
                    ,0x34d);
    bVar2 = true;
    do {
      bVar7 = bVar2;
      uVar1 = (&depth_stencil_renderable_internalformats)[lVar6];
      (**(code **)(lVar5 + 0x880))(0x9102,uVar1,0x80a9,1,&local_40);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"Querying texture target-spcecific maximum sample value failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
                      ,0x35a);
      lVar6 = 0;
      bVar2 = true;
      do {
        bVar8 = bVar2;
        iVar3 = local_3c;
        if (local_3c < local_40) {
          iVar3 = local_40;
        }
        (**(code **)(lVar5 + 0x13a8))
                  (0x9102,iVar3 + 1,uVar1,1,1,1,fixed_sample_locations_values[lVar6]);
        iVar3 = (**(code **)(lVar5 + 0x800))();
        if (iVar3 != 0x502) {
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,
                     "gltexStorage3DMultisample() did not generate GL_INVALID_OPERATION error.",
                     "gl.getError() == GL_INVALID_OPERATION",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
                     ,0x36a);
          goto LAB_00c072e6;
        }
        lVar6 = 1;
        bVar2 = false;
      } while (bVar8);
      lVar6 = 1;
      bVar2 = false;
    } while (bVar7);
    this_01 = (local_38->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
  else {
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "OES_texture_storage_multisample_2d_array";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_01,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult RequestsToSetUpMultisampleStencilTexturesWithUnsupportedNumberOfSamplesAreRejectedTest::
	iterate()
{
	gl_oes_texture_multisample_2d_array_supported =
		m_context.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array");

	if (!gl_oes_texture_multisample_2d_array_supported)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "OES_texture_storage_multisample_2d_array");

		return STOP;
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	initInternals();

	/* Check if texture object was generated properly. */
	TCU_CHECK_MSG(to_id != 0, "Texture object has not been generated.");

	glw::GLint internalformat_specific_max_samples = 0;
	glw::GLint max_depth_texture_samples		   = 0;
	int		   number_of_depth_stencil_renderable_internalformats_to_check =
		sizeof(depth_stencil_renderable_internalformats) / sizeof(depth_stencil_renderable_internalformats[0]);
	int number_of_fixed_sample_locations_values_to_check =
		sizeof(fixed_sample_locations_values) / sizeof(fixed_sample_locations_values[0]);

	/* Retrieve maximum depth texture samples value. */
	gl.getIntegerv(GL_MAX_DEPTH_TEXTURE_SAMPLES, &max_depth_texture_samples);

	/* Expect no error was generated. */
	GLU_EXPECT_NO_ERROR(gl.getError(), "Querying maximum sample value failed.");

	/* Go through all supported depth-stencil renderable internal formats. */
	for (int depth_stencil_renderable_internalformat_index = 0;
		 depth_stencil_renderable_internalformat_index < number_of_depth_stencil_renderable_internalformats_to_check;
		 depth_stencil_renderable_internalformat_index++)
	{
		/* Retrieve maximum amount of samples available for the texture target considered */
		gl.getInternalformativ(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES,
							   depth_stencil_renderable_internalformats[depth_stencil_renderable_internalformat_index],
							   GL_SAMPLES, 1, &internalformat_specific_max_samples);

		/* Expect no error was generated. */
		GLU_EXPECT_NO_ERROR(gl.getError(), "Querying texture target-spcecific maximum sample value failed.");

		/* Go through all possible sample locations values. */
		for (int fixed_sample_locations_values_index = 0;
			 fixed_sample_locations_values_index < number_of_fixed_sample_locations_values_to_check;
			 fixed_sample_locations_values_index++)
		{
			glw::GLsizei samples = de::max(internalformat_specific_max_samples, max_depth_texture_samples) + 1;

			gl.texStorage3DMultisample(
				GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, samples,
				depth_stencil_renderable_internalformats[depth_stencil_renderable_internalformat_index], 1, 1, 1,
				fixed_sample_locations_values[fixed_sample_locations_values_index]);

			/* Expect GL_INVALID_OPERATION to be returned. */
			TCU_CHECK_MSG(gl.getError() == GL_INVALID_OPERATION,
						  "gltexStorage3DMultisample() did not generate GL_INVALID_OPERATION error.");

		} /* for each fixed sample locations value */
	}	 /* for each depth-stencil renderable internalformat */

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}